

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_efdctsidz(CPUPPCState_conflict *env,uint64_t val)

{
  int iVar1;
  CPU_DoubleU u;
  uint64_t val_local;
  CPUPPCState_conflict *env_local;
  
  iVar1 = float64_is_any_nan(val);
  if (iVar1 == 0) {
    env_local = (CPUPPCState_conflict *)float64_to_int64_round_to_zero_ppc(val,&env->vec_status);
  }
  else {
    env_local = (CPUPPCState_conflict *)0x0;
  }
  return (uint64_t)env_local;
}

Assistant:

uint64_t helper_efdctsidz(CPUPPCState *env, uint64_t val)
{
    CPU_DoubleU u;

    u.ll = val;
    /* NaN are not treated the same way IEEE 754 does */
    if (unlikely(float64_is_any_nan(u.d))) {
        return 0;
    }

    return float64_to_int64_round_to_zero(u.d, &env->vec_status);
}